

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::GlobalConstPoolPass::run(GlobalConstPoolPass *this,Zone *zone,Logger *logger)

{
  BaseBuilder *this_00;
  RegOnly node;
  
  this_00 = (this->super_Pass)._cb;
  node = this_00[1].super_BaseEmitter._extraReg;
  if (node != (RegOnly)0x0) {
    BaseBuilder::addAfter(this_00,(BaseNode *)node,*(BaseNode **)&this_00->field_0x1a8);
    this_00[1].super_BaseEmitter._extraReg._signature = 0;
    this_00[1].super_BaseEmitter._extraReg._id = 0;
  }
  return 0;
}

Assistant:

Error run(Zone* zone, Logger* logger) override {
    DebugUtils::unused(zone, logger);

    // Flush the global constant pool.
    BaseCompiler* compiler = static_cast<BaseCompiler*>(_cb);
    ConstPoolNode* globalConstPool = compiler->_constPools[uint32_t(ConstPoolScope::kGlobal)];

    if (globalConstPool) {
      compiler->addAfter(globalConstPool, compiler->lastNode());
      compiler->_constPools[uint32_t(ConstPoolScope::kGlobal)] = nullptr;
    }

    return kErrorOk;
  }